

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsetools.c
# Opt level: O0

int has_xml_content_type(http_message_t *hmsg)

{
  parse_status_t pVar1;
  http_header_t *phVar2;
  undefined1 local_28 [8];
  memptr hdr_value;
  http_message_t *hmsg_local;
  
  hdr_value.length = (size_t)hmsg;
  if (hmsg != (http_message_t *)0x0) {
    phVar2 = httpmsg_find_hdr(hmsg,4,(memptr *)local_28);
    if ((phVar2 == (http_header_t *)0x0) ||
       (pVar1 = matchstr((char *)local_28,(size_t)hdr_value.buf,"%itext%w/%wxml"), pVar1 != PARSE_OK
       )) {
      hmsg_local._4_4_ = 0;
    }
    else {
      hmsg_local._4_4_ = 1;
    }
    return hmsg_local._4_4_;
  }
  __assert_fail("hmsg",".upnp/src/genlib/net/http/parsetools.c",0x34,
                "int has_xml_content_type(http_message_t *)");
}

Assistant:

int has_xml_content_type(http_message_t *hmsg)
{
	memptr hdr_value;

	assert(hmsg);

	/* find 'content-type' header which must have text/xml */
	if (httpmsg_find_hdr(hmsg, HDR_CONTENT_TYPE, &hdr_value)) {
		switch (matchstr(
			hdr_value.buf, hdr_value.length, "%itext%w/%wxml")) {
		case PARSE_OK:
			return 1;
		default:
			break;
		}
	}
	return 0;
}